

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O1

bool IsAfter(VmInstruction *a,VmInstruction *b)

{
  bool bVar1;
  
  if (a->parent != b->parent) {
    __assert_fail("a->parent == b->parent",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x1b8c,"bool IsAfter(VmInstruction *, VmInstruction *)");
  }
  bVar1 = b != (VmInstruction *)0x0;
  if (b != a && bVar1) {
    do {
      b = b->nextSibling;
      bVar1 = b != (VmInstruction *)0x0;
      if (b == a) {
        return bVar1;
      }
    } while (b != (VmInstruction *)0x0);
  }
  return bVar1;
}

Assistant:

bool IsAfter(VmInstruction *a, VmInstruction *b)
{
	assert(a->parent == b->parent);

	while(b)
	{
		if(a == b)
			return true;

		b = b->nextSibling;
	}

	return false;
}